

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O3

SRes LzmaDec_AllocateProbs(CLzmaDec *p,Byte *props,uint propsSize,ISzAlloc *alloc)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  SRes SVar4;
  UInt16 *pUVar5;
  byte bVar6;
  uint uVar7;
  UInt32 UVar8;
  
  SVar4 = 4;
  if (4 < propsSize) {
    uVar7 = 0x1000;
    if (0x1000 < *(uint *)(props + 1)) {
      uVar7 = *(uint *)(props + 1);
    }
    bVar1 = *props;
    SVar4 = 4;
    if (bVar1 < 0xe1) {
      cVar3 = (char)(bVar1 / 9);
      bVar6 = bVar1 + cVar3 * -9;
      bVar2 = cVar3 + (char)((bVar1 / 9) * 0x34 >> 8) * -5;
      UVar8 = (0x300 << (bVar2 + bVar6 & 0x1f)) + 0x736;
      if ((p->probs == (UInt16 *)0x0) || (UVar8 != p->numProbs)) {
        (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,p->probs);
        p->probs = (UInt16 *)0x0;
        pUVar5 = (UInt16 *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,(ulong)(UVar8 * 2));
        p->probs = pUVar5;
        p->numProbs = UVar8;
        if (pUVar5 == (UInt16 *)0x0) {
          return 2;
        }
      }
      cVar3 = (char)((uint)bVar1 * 0x6d >> 8);
      (p->prop).lc = (uint)bVar6;
      (p->prop).lp = (uint)bVar2;
      (p->prop).pb = (uint)((byte)(((byte)(bVar1 - cVar3) >> 1) + cVar3) >> 5);
      (p->prop).dicSize = uVar7;
      SVar4 = 0;
    }
  }
  return SVar4;
}

Assistant:

static SRes LzmaDec_AllocateProbs(CLzmaDec *p, const Byte *props, unsigned propsSize, ISzAlloc *alloc)
{
  CLzmaProps propNew;
  RINOK(LzmaProps_Decode(&propNew, props, propsSize));
  RINOK(LzmaDec_AllocateProbs2(p, &propNew, alloc));
  p->prop = propNew;
  return SZ_OK;
}